

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::
EventsProcessorLeftMouseButtonUpEventTests(EventsProcessorLeftMouseButtonUpEventTests *this)

{
  StrictMock<solitaire::SolitaireMock> *mock_obj;
  StrictMock<solitaire::ContextMock> *mock_obj_00;
  FunctionMocker<solitaire::interfaces::Solitaire_&()> *this_00;
  FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_01;
  FunctionMocker<solitaire::geometry::Position_()> *this_02;
  Position PVar1;
  TypedExpectation<solitaire::interfaces::Solitaire_&()> *this_03;
  ActionInterface<solitaire::interfaces::Solitaire_&()> *impl;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_04;
  ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *impl_00;
  TypedExpectation<solitaire::geometry::Position_()> *this_05;
  ActionInterface<solitaire::geometry::Position_()> *impl_01;
  _Any_data _Stack_68;
  code *local_58;
  MockSpec<solitaire::interfaces::Solitaire_&()> local_48;
  Position *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  EventsProcessorTests::EventsProcessorTests(&this->super_EventsProcessorTests);
  (this->super_EventsProcessorTests).super_Test._vptr_Test =
       (_func_int **)&PTR__EventsProcessorLeftMouseButtonUpEventTests_003234c0;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->cardsInHand,5,(allocator_type *)_Stack_68._M_pod_data);
  _Stack_68._M_pod_data[8] = '\x02';
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)&_Stack_68);
  mock_obj_00 = &(this->super_EventsProcessorTests).contextMock;
  this_00 = &(this->super_EventsProcessorTests).contextMock.super_ContextMock.
             gmock00_getSolitaire_15;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj_00);
  local_48.function_mocker_ = this_00;
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::InternalExpectedAt
                      (&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x171,"contextMock","getSolitaire()");
  impl = (ActionInterface<solitaire::interfaces::Solitaire_&()> *)operator_new(0x10);
  mock_obj = &(this->super_EventsProcessorTests).solitaireMock;
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_003238f0;
  impl[1]._vptr_ActionInterface = (_func_int **)mock_obj;
  testing::Action<solitaire::interfaces::Solitaire_&()>::Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)&_Stack_68,impl);
  testing::internal::TypedExpectation<solitaire::interfaces::Solitaire_&()>::WillOnce
            (this_03,(Action<solitaire::interfaces::Solitaire_&()> *)&_Stack_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  this_01 = &(this->super_EventsProcessorTests).solitaireMock.super_SolitaireMock.
             gmock10_getCardsInHand_34;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_01->super_UntypedFunctionMockerBase,mock_obj);
  local_48.function_mocker_ = (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)this_01;
  testing::internal::GetWithoutMatchers();
  this_04 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x172,"solitaireMock","getCardsInHand()");
  impl_00 = (ActionInterface<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
             *)operator_new(0x10);
  impl_00->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00320b90;
  impl_00[1]._vptr_ActionInterface = (_func_int **)&this->cardsInHand;
  testing::
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
  Action((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
          *)&_Stack_68,impl_00);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_04,(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)&_Stack_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  this_02 = &(this->super_EventsProcessorTests).contextMock.super_ContextMock.
             gmock10_getCardsInHandPosition_43;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_02->super_UntypedFunctionMockerBase,mock_obj_00);
  local_48.function_mocker_ = (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)this_02;
  testing::internal::GetWithoutMatchers();
  this_05 = testing::internal::MockSpec<solitaire::geometry::Position_()>::InternalExpectedAt
                      ((MockSpec<solitaire::geometry::Position_()> *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x173,"contextMock","getCardsInHandPosition()");
  local_38 = (Position *)operator_new(8);
  local_38->x = 0x2e;
  local_38->y = 0x1a;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<solitaire::geometry::Position*>
            (&local_30,local_38);
  impl_01 = (ActionInterface<solitaire::geometry::Position_()> *)operator_new(0x18);
  impl_01->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00323ab0;
  PVar1 = *local_38;
  *(Position *)(impl_01 + 1) = PVar1;
  *(Position *)(impl_01 + 2) = PVar1;
  testing::Action<solitaire::geometry::Position_()>::Action
            ((Action<solitaire::geometry::Position_()> *)&_Stack_68,impl_01);
  testing::internal::TypedExpectation<solitaire::geometry::Position_()>::WillOnce
            (this_05,(Action<solitaire::geometry::Position_()> *)&_Stack_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  return;
}

Assistant:

EventsProcessorLeftMouseButtonUpEventTests() {
        expectEvent(MouseLeftButtonUp {});
        EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
        EXPECT_CALL(solitaireMock, getCardsInHand()).WillOnce(ReturnRef(cardsInHand));
        EXPECT_CALL(contextMock, getCardsInHandPosition()).WillOnce(Return(cardsInHandPosition));
    }